

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

int xmlSchemaNormLen(xmlChar *value)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  
  if (value == (xmlChar *)0x0) {
LAB_001b2225:
    iVar1 = -1;
  }
  else {
    while (((ulong)*value < 0x21 && ((0x100002600U >> ((ulong)*value & 0x3f) & 1) != 0))) {
      value = value + 1;
    }
    iVar1 = 0;
    bVar2 = *value;
    while (bVar2 != 0) {
      if ((char)bVar2 < '\0') goto LAB_001b2225;
      if ((bVar2 < 0x21) && ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        for (; uVar3 = (ulong)*value, uVar3 < 0x21; value = value + 1) {
          if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) {
            if (uVar3 == 0) {
              return iVar1;
            }
            break;
          }
        }
      }
      else {
        value = value + 1;
      }
      iVar1 = iVar1 + 1;
      bVar2 = *value;
    }
  }
  return iVar1;
}

Assistant:

static int
xmlSchemaNormLen(const xmlChar *value) {
    const xmlChar *utf;
    int ret = 0;

    if (value == NULL)
	return(-1);
    utf = value;
    while (IS_BLANK_CH(*utf)) utf++;
    while (*utf != 0) {
	if (utf[0] & 0x80) {
	    if ((utf[1] & 0xc0) != 0x80)
		return(-1);
	    if ((utf[0] & 0xe0) == 0xe0) {
		if ((utf[2] & 0xc0) != 0x80)
		    return(-1);
		if ((utf[0] & 0xf0) == 0xf0) {
		    if ((utf[0] & 0xf8) != 0xf0 || (utf[3] & 0xc0) != 0x80)
			return(-1);
		    utf += 4;
		} else {
		    utf += 3;
		}
	    } else {
		utf += 2;
	    }
	} else if (IS_BLANK_CH(*utf)) {
	    while (IS_BLANK_CH(*utf)) utf++;
	    if (*utf == 0)
		break;
	} else {
	    utf++;
	}
	ret++;
    }
    return(ret);
}